

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O1

bool __thiscall
fast_float::large_add_from<(unsigned_short)62>
          (fast_float *this,stackvec<(unsigned_short)62> *x,limb_span y,size_t start)

{
  ulong uVar1;
  fast_float *pfVar2;
  ushort uVar3;
  bool bVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  size_t index;
  ulong uVar11;
  bool bVar12;
  
  uVar11 = y.length;
  puVar5 = y.ptr;
  uVar3 = *(ushort *)(this + 0x1f0);
  uVar7 = (ulong)uVar3;
  if ((unsigned_long *)(uVar7 - uVar11) < puVar5 || uVar7 < uVar11) {
    uVar1 = uVar11 + (long)puVar5;
    if (uVar1 < 0x3f) {
      if (uVar7 < uVar1) {
        memset(this + (ulong)uVar3 * 8,0,uVar1 * 8 + (ulong)uVar3 * -8);
      }
      *(short *)(this + 0x1f0) = (short)uVar1;
      if (uVar1 < 0x3f) goto LAB_003a0fe1;
    }
LAB_003a106b:
    bVar4 = false;
  }
  else {
LAB_003a0fe1:
    bVar4 = true;
    if (puVar5 != (unsigned_long *)0x0) {
      puVar6 = (unsigned_long *)0x0;
      bVar12 = false;
      do {
        uVar7 = *(ulong *)(this + (long)puVar6 * 8 + uVar11 * 8);
        uVar1 = x->data[(long)puVar6];
        lVar8 = uVar7 + x->data[(long)puVar6];
        lVar9 = lVar8 + 1;
        lVar10 = lVar9;
        if (!bVar12) {
          lVar10 = lVar8;
        }
        *(long *)(this + (long)puVar6 * 8 + uVar11 * 8) = lVar10;
        bVar12 = (bool)(lVar9 == 0 & bVar12 | CARRY8(uVar7,uVar1));
        puVar6 = (unsigned_long *)((long)puVar6 + 1);
      } while (puVar5 != puVar6);
      if (bVar12) {
        uVar11 = uVar11 + (long)puVar5;
        uVar3 = *(ushort *)(this + 0x1f0);
        uVar7 = 1;
        do {
          if (uVar3 <= uVar11) {
            if (uVar3 < 0x3e) {
              *(ulong *)(this + (ulong)uVar3 * 8) = uVar7;
              *(ushort *)(this + 0x1f0) = uVar3 + 1;
              return true;
            }
            goto LAB_003a106b;
          }
          pfVar2 = this + uVar11 * 8;
          bVar12 = CARRY8(*(ulong *)pfVar2,uVar7);
          *(ulong *)pfVar2 = *(ulong *)pfVar2 + uVar7;
          uVar11 = uVar11 + 1;
          uVar7 = (ulong)bVar12;
        } while (bVar12);
      }
    }
  }
  return bVar4;
}

Assistant:

FASTFLOAT_CONSTEXPR20
bool large_add_from(stackvec<size>& x, limb_span y, size_t start) noexcept {
  // the effective x buffer is from `xstart..x.len()`, so exit early
  // if we can't get that current range.
  if (x.len() < start || y.len() > x.len() - start) {
      FASTFLOAT_TRY(x.try_resize(y.len() + start, 0));
  }

  bool carry = false;
  for (size_t index = 0; index < y.len(); index++) {
    limb xi = x[index + start];
    limb yi = y[index];
    bool c1 = false;
    bool c2 = false;
    xi = scalar_add(xi, yi, c1);
    if (carry) {
      xi = scalar_add(xi, 1, c2);
    }
    x[index + start] = xi;
    carry = c1 | c2;
  }

  // handle overflow
  if (carry) {
    FASTFLOAT_TRY(small_add_from(x, 1, y.len() + start));
  }
  return true;
}